

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

Abc_Obj_t *
Sfm_DecInsert(Abc_Ntk_t *pNtk,Abc_Obj_t *pPivot,int Limit,Vec_Int_t *vGates,Vec_Wec_t *vFanins,
             Vec_Int_t *vMap,Vec_Ptr_t *vGateHandles,int GateBuf,int GateInv,Vec_Wrd_t *vFuncs,
             Vec_Int_t *vTimeNodes,Sfm_Mit_t *pMit)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  Mio_Gate_t *pGate;
  Abc_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint iGate;
  uint uVar7;
  Abc_Obj_t *pAVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iFaninNew;
  uint local_64;
  Abc_Obj_t *local_60;
  Abc_Ntk_t *local_58;
  Vec_Wec_t *local_50;
  int local_48;
  int local_44;
  ulong local_40;
  Vec_Int_t *local_38;
  
  uVar9 = (ulong)(uint)Limit;
  if (vTimeNodes != (Vec_Int_t *)0x0) {
    vTimeNodes->nSize = 0;
  }
  uVar6 = vGates->nSize;
  local_58 = pNtk;
  if ((int)uVar6 <= Limit) {
    __assert_fail("Limit < Vec_IntSize(vGates)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x6a4,
                  "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                 );
  }
  if (vMap->nSize != Limit) {
    __assert_fail("Limit == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x6a5,
                  "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                 );
  }
  local_60 = pPivot;
  local_40 = uVar9;
  if (Limit + 1U == uVar6) {
    if ((int)uVar6 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    if (vGates->pArray[(ulong)uVar6 - 1] == GateBuf) {
      if ((Limit < 0) || (vFanins->nSize <= Limit)) {
LAB_004bbf47:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if ((0 < vFanins->pArray[(uint)Limit].nSize) &&
         (uVar6 = *vFanins->pArray[(uint)Limit].pArray, uVar6 < (uint)Limit)) {
        iVar4 = vMap->pArray[uVar6];
        if ((-1 < (long)iVar4) && (iVar4 < pNtk->vObjs->nSize)) {
          pAVar8 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar4];
          if (pMit != (Sfm_Mit_t *)0x0) {
            Sfm_MitTransferLoad(pMit,pAVar8,pPivot);
          }
          Abc_ObjReplace(pPivot,pAVar8);
          *(uint *)&pAVar8->field_0x14 = *(uint *)&pAVar8->field_0x14 & 0xfff;
          Abc_NtkUpdateIncLevel_rec(pAVar8);
          if (vTimeNodes == (Vec_Int_t *)0x0) {
            return pAVar8;
          }
          Vec_IntPush(vTimeNodes,pAVar8->Id);
          return pAVar8;
        }
LAB_004bbf09:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
LAB_004bbf28:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((vTimeNodes == (Vec_Int_t *)0x0) && (vGates->pArray[(ulong)uVar6 - 1] == GateInv)) {
      iVar4 = (pPivot->vFanouts).nSize;
      iVar5 = 0;
      local_50 = vFanins;
      if ((0 < iVar4) &&
         (pAVar8 = (Abc_Obj_t *)pPivot->pNtk->vObjs->pArray[*(pPivot->vFanouts).pArray],
         (*(uint *)&pAVar8->field_0x14 & 0xf) == 7)) {
        lVar10 = 1;
        do {
          lVar11 = lVar10;
          pAVar3 = local_60;
          local_44 = Mio_GateReadValue((Mio_Gate_t *)(pAVar8->field_5).pData);
          local_48 = (pAVar8->vFanins).nSize;
          iVar4 = Abc_NodeFindFanin(pAVar8,pAVar3);
          iVar5 = Sfm_LibFindComplInputGate(vFuncs,local_44,local_48,iVar4,(int *)0x0);
          iVar4 = (pAVar3->vFanouts).nSize;
          if (iVar5 == -1) {
            lVar11 = lVar11 + -1;
            break;
          }
          if (iVar4 <= lVar11) break;
          pAVar8 = (Abc_Obj_t *)local_60->pNtk->vObjs->pArray[(local_60->vFanouts).pArray[lVar11]];
          lVar10 = lVar11 + 1;
        } while ((*(uint *)&pAVar8->field_0x14 & 0xf) == 7);
        iVar5 = (int)lVar11;
      }
      if (iVar5 == iVar4) {
        if (0 < iVar4) {
          lVar10 = 0;
          do {
            pAVar8 = (Abc_Obj_t *)local_60->pNtk->vObjs->pArray[(local_60->vFanouts).pArray[lVar10]]
            ;
            uVar6 = Abc_NodeFindFanin(pAVar8,local_60);
            local_64 = 0xffffffff;
            iGate = Mio_GateReadValue((Mio_Gate_t *)(pAVar8->field_5).pData);
            uVar7 = Sfm_LibFindComplInputGate
                              (vFuncs,iGate,(pAVar8->vFanins).nSize,uVar6,(int *)&local_64);
            if ((((int)uVar7 < 0) || (uVar7 == iGate)) || ((int)local_64 < 0)) {
              __assert_fail("iGateNew >= 0 && iGateNew != iGate && iFaninNew >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                            ,0x6c8,
                            "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                           );
            }
            if (vGateHandles->nSize <= (int)uVar7) goto LAB_004bbf09;
            pAVar8->field_5 =
                 *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)(vGateHandles->pArray + uVar7);
            if (uVar6 != local_64) {
              piVar1 = (pAVar8->vFanins).pArray;
              iVar4 = piVar1[(int)uVar6];
              piVar1[(int)uVar6] = piVar1[local_64];
              piVar1[(int)local_64] = iVar4;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (local_60->vFanouts).nSize);
        }
        if (((int)local_40 < 0) || (local_50->nSize <= (int)local_40)) goto LAB_004bbf47;
        if (0 < local_50->pArray[local_40 & 0xffffffff].nSize) {
          iVar4 = *local_50->pArray[local_40 & 0xffffffff].pArray;
          if ((-1 < (long)iVar4) && (iVar4 < vMap->nSize)) {
            iVar4 = vMap->pArray[iVar4];
            if ((-1 < (long)iVar4) && (iVar4 < local_58->vObjs->nSize)) {
              pAVar8 = (Abc_Obj_t *)local_58->vObjs->pArray[iVar4];
              Abc_ObjReplace(local_60,pAVar8);
              *(uint *)&pAVar8->field_0x14 = *(uint *)&pAVar8->field_0x14 & 0xfff;
              Abc_NtkUpdateIncLevel_rec(pAVar8);
              return pAVar8;
            }
            goto LAB_004bbf09;
          }
        }
        goto LAB_004bbf28;
      }
      uVar6 = vGates->nSize;
      vFanins = local_50;
    }
  }
  if (Limit < (int)uVar6) {
    uVar12 = (ulong)(uint)Limit;
    local_50 = vFanins;
    local_38 = vGates;
    do {
      if ((int)uVar9 < 0) goto LAB_004bbf28;
      if (vFanins->nSize <= (int)uVar12) goto LAB_004bbf47;
      uVar6 = local_38->pArray[uVar12];
      pVVar2 = vFanins->pArray;
      pAVar8 = Abc_NtkCreateObj(local_58,ABC_OBJ_NODE);
      if (0 < pVVar2[uVar12].nSize) {
        lVar10 = 0;
        do {
          iVar4 = pVVar2[uVar12].pArray[lVar10];
          if (((long)iVar4 < 0) || (vMap->nSize <= iVar4)) goto LAB_004bbf28;
          iVar4 = vMap->pArray[iVar4];
          if (((long)iVar4 < 0) || (local_58->vObjs->nSize <= iVar4)) goto LAB_004bbf09;
          Abc_ObjAddFanin(pAVar8,(Abc_Obj_t *)local_58->vObjs->pArray[iVar4]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar2[uVar12].nSize);
      }
      if (((int)uVar6 < 0) || (vGateHandles->nSize <= (int)uVar6)) goto LAB_004bbf09;
      pGate = (Mio_Gate_t *)vGateHandles->pArray[uVar6];
      (pAVar8->field_5).pData = pGate;
      iVar4 = (pAVar8->vFanins).nSize;
      iVar5 = Mio_GateReadPinNum(pGate);
      vFanins = local_50;
      if (iVar4 != iVar5) {
        __assert_fail("Abc_ObjFaninNum(pObjNew) == Mio_GateReadPinNum((Mio_Gate_t *)pObjNew->pData)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                      ,0x6e4,
                      "Abc_Obj_t *Sfm_DecInsert(Abc_Ntk_t *, Abc_Obj_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Ptr_t *, int, int, Vec_Wrd_t *, Vec_Int_t *, Sfm_Mit_t *)"
                     );
      }
      Vec_IntPush(vMap,pAVar8->Id);
      uVar9 = local_40;
      if (vTimeNodes != (Vec_Int_t *)0x0) {
        Vec_IntPush(vTimeNodes,pAVar8->Id);
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < local_38->nSize);
  }
  else {
    pAVar8 = (Abc_Obj_t *)0x0;
  }
  pAVar3 = local_60;
  if (pMit != (Sfm_Mit_t *)0x0) {
    Sfm_MitTimingGrow(pMit);
    Sfm_MitTransferLoad(pMit,pAVar8,pAVar3);
  }
  Abc_ObjReplace(pAVar3,pAVar8);
  iVar4 = vMap->nSize;
  if ((int)uVar9 < iVar4) {
    uVar12 = uVar9 & 0xffffffff;
    do {
      if ((int)uVar9 < 0) goto LAB_004bbf28;
      iVar5 = vMap->pArray[uVar12];
      if (((long)iVar5 < 0) || (local_58->vObjs->nSize <= iVar5)) goto LAB_004bbf09;
      pAVar8 = (Abc_Obj_t *)local_58->vObjs->pArray[iVar5];
      if (pAVar8 != (Abc_Obj_t *)0x0) {
        Abc_NtkUpdateIncLevel_rec(pAVar8);
        iVar4 = vMap->nSize;
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < iVar4);
  }
  return pAVar8;
}

Assistant:

Abc_Obj_t * Sfm_DecInsert( Abc_Ntk_t * pNtk, Abc_Obj_t * pPivot, int Limit, Vec_Int_t * vGates, Vec_Wec_t * vFanins, Vec_Int_t * vMap, Vec_Ptr_t * vGateHandles, int GateBuf, int GateInv, Vec_Wrd_t * vFuncs, Vec_Int_t * vTimeNodes, Sfm_Mit_t * pMit )
{
    Abc_Obj_t * pObjNew = NULL; 
    Vec_Int_t * vLevel;
    int i, k, iObj, Gate;
    if ( vTimeNodes )
        Vec_IntClear( vTimeNodes );
    // assuming that new gates are appended at the end
    assert( Limit < Vec_IntSize(vGates) );
    assert( Limit == Vec_IntSize(vMap) );
    if ( Limit + 1 == Vec_IntSize(vGates) )
    {
        Gate = Vec_IntEntryLast(vGates);
        if ( Gate == GateBuf )
        {
            iObj = Vec_WecEntryEntry( vFanins, Limit, 0 );
            pObjNew = Abc_NtkObj( pNtk, Vec_IntEntry(vMap, iObj) );
            // transfer load
            if ( pMit )
                Sfm_MitTransferLoad( pMit, pObjNew, pPivot );
            // replace logic cone
            Abc_ObjReplace( pPivot, pObjNew );
            // update level
            pObjNew->Level = 0;
            Abc_NtkUpdateIncLevel_rec( pObjNew );
            if ( vTimeNodes )
                Vec_IntPush( vTimeNodes, Abc_ObjId(pObjNew) );
            return pObjNew;
        }
        else if ( vTimeNodes == NULL && Gate == GateInv )
        {
            // check if fanouts can be updated
            Abc_Obj_t * pFanout;
            Abc_ObjForEachFanout( pPivot, pFanout, i )
                if ( !Abc_ObjIsNode(pFanout) || Sfm_LibFindComplInputGate(vFuncs, Mio_GateReadValue((Mio_Gate_t*)pFanout->pData), Abc_ObjFaninNum(pFanout), Abc_NodeFindFanin(pFanout, pPivot), NULL) == -1 )
                    break;
            // update fanouts
            if ( i == Abc_ObjFanoutNum(pPivot) )
            {
                Abc_ObjForEachFanout( pPivot, pFanout, i )
                {
                    int iFanin = Abc_NodeFindFanin(pFanout, pPivot), iFaninNew = -1;
                    int iGate = Mio_GateReadValue((Mio_Gate_t*)pFanout->pData);
                    int iGateNew = Sfm_LibFindComplInputGate( vFuncs, iGate, Abc_ObjFaninNum(pFanout), iFanin, &iFaninNew );
                    assert( iGateNew >= 0 && iGateNew != iGate && iFaninNew >= 0 );
                    pFanout->pData = Vec_PtrEntry( vGateHandles, iGateNew );
                    //assert( iFanin == iFaninNew );
                    // swap fanins
                    if ( iFanin != iFaninNew )
                    {
                        int * pArray = Vec_IntArray( &pFanout->vFanins );
                        ABC_SWAP( int, pArray[iFanin], pArray[iFaninNew] );
                    }
                }
                iObj = Vec_WecEntryEntry( vFanins, Limit, 0 );
                pObjNew = Abc_NtkObj( pNtk, Vec_IntEntry(vMap, iObj) );
                Abc_ObjReplace( pPivot, pObjNew );
                // update level
                pObjNew->Level = 0;
                Abc_NtkUpdateIncLevel_rec( pObjNew );
                return pObjNew;
            }
        }
    }
    // introduce new gates
    Vec_IntForEachEntryStart( vGates, Gate, i, Limit )
    {
        vLevel = Vec_WecEntry( vFanins, i );
        pObjNew = Abc_NtkCreateNode( pNtk );
        Vec_IntForEachEntry( vLevel, iObj, k )
            Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, iObj)) );
        pObjNew->pData = Vec_PtrEntry( vGateHandles, Gate );
        assert( Abc_ObjFaninNum(pObjNew) == Mio_GateReadPinNum((Mio_Gate_t *)pObjNew->pData) );
        Vec_IntPush( vMap, Abc_ObjId(pObjNew) );
        if ( vTimeNodes )
            Vec_IntPush( vTimeNodes, Abc_ObjId(pObjNew) );
    }
    // transfer load
    if ( pMit )
    {
        Sfm_MitTimingGrow( pMit );
        Sfm_MitTransferLoad( pMit, pObjNew, pPivot );
    }
    // replace logic cone
    Abc_ObjReplace( pPivot, pObjNew );
    // update level
    Abc_NtkForEachObjVecStart( vMap, pNtk, pObjNew, i, Limit )
        Abc_NtkUpdateIncLevel_rec( pObjNew );
    return pObjNew;
}